

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O1

NeuralNetwork *
buildBasicNeuralNetworkModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,TensorAttributes *outTensorAttr,
          int numberOfLayers,bool areWeightsQuantized,bool isBiasQuantized)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<float> *pRVar2;
  uint uVar3;
  Rep *pRVar4;
  ConvolutionLayerParams *pCVar5;
  RepeatedPtrFieldBase *this;
  uint uVar6;
  uint uVar7;
  ModelDescription *pMVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  long *plVar11;
  void *pvVar12;
  NeuralNetwork *pNVar13;
  NeuralNetworkLayer *pNVar14;
  TensorAttributes *pTVar15;
  InnerProductLayerParams *pIVar16;
  WeightParams *pWVar17;
  QuantizationParams *pQVar18;
  LinearQuantizationParams *pLVar19;
  float *pfVar20;
  undefined1 *puVar21;
  FeatureDescription *pFVar22;
  ulong uVar23;
  long *plVar24;
  undefined8 *puVar25;
  uint uVar26;
  int iVar27;
  undefined7 in_register_00000031;
  ArenaStringPtr *pAVar28;
  Arena *pAVar29;
  undefined4 in_register_00000084;
  undefined3 in_register_00000089;
  long lVar30;
  long lVar31;
  uint uVar32;
  uint uVar33;
  void **ppvVar34;
  string output;
  string layerName;
  string __str_1;
  TensorAttributes local_100;
  long local_f0;
  long lStack_e8;
  TensorAttributes local_e0;
  long local_d0;
  long lStack_c8;
  undefined4 local_bc;
  undefined8 local_b8;
  TensorAttributes *local_b0;
  TensorAttributes *local_a8;
  NeuralNetworkLayer *local_a0;
  FeatureDescription local_98;
  uint local_68;
  undefined4 local_64;
  RepeatedPtrFieldBase *local_60;
  NeuralNetwork *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_64 = CONCAT31(in_register_00000089,areWeightsQuantized);
  local_b8 = CONCAT44(in_register_00000084,numberOfLayers);
  local_bc = (undefined4)CONCAT71(in_register_00000031,isUpdatable);
  local_b0 = outTensorAttr;
  local_a8 = inTensorAttr;
  if (m->description_ == (ModelDescription *)0x0) {
    uVar23 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar29 = (Arena *)(uVar23 & 0xfffffffffffffffc);
    if ((uVar23 & 1) != 0) {
      pAVar29 = *(Arena **)pAVar29;
    }
    pMVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar29);
    m->description_ = pMVar8;
  }
  pMVar8 = m->description_;
  pRVar4 = (pMVar8->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00200368:
    pFVar22 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar8->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar8->input_).super_RepeatedPtrFieldBase,pFVar22);
  }
  else {
    iVar27 = (pMVar8->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar27) goto LAB_00200368;
    (pMVar8->input_).super_RepeatedPtrFieldBase.current_size_ = iVar27 + 1;
    pvVar12 = pRVar4->elements[iVar27];
  }
  puVar25 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar25 = (undefined8 *)*puVar25;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),local_a8->name,puVar25);
  if (*(long *)((long)pvVar12 + 0x20) == 0) {
    pAVar29 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar29 = *(Arena **)pAVar29;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar29);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar23 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar29 = (Arena *)(uVar23 & 0xfffffffffffffffc);
    if ((uVar23 & 1) != 0) {
      pAVar29 = *(Arena **)pAVar29;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar29);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  pAVar10->datatype_ = 0x10020;
  if (0 < local_a8->dimension) {
    pRVar1 = &pAVar10->shape_;
    iVar27 = 0;
    do {
      uVar26 = (pAVar10->shape_).current_size_;
      uVar32 = (pAVar10->shape_).total_size_;
      if (uVar26 == uVar32) {
        google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar32 + 1);
      }
      plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
      plVar11[uVar26] = 1;
      pRVar1->current_size_ = uVar26 + 1;
      iVar27 = iVar27 + 1;
    } while (iVar27 < local_a8->dimension);
  }
  if (m->description_ == (ModelDescription *)0x0) {
    uVar23 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar29 = (Arena *)(uVar23 & 0xfffffffffffffffc);
    if ((uVar23 & 1) != 0) {
      pAVar29 = *(Arena **)pAVar29;
    }
    pMVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar29);
    m->description_ = pMVar8;
  }
  pMVar8 = m->description_;
  pRVar4 = (pMVar8->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar27 = (pMVar8->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar27 < pRVar4->allocated_size) {
      (pMVar8->output_).super_RepeatedPtrFieldBase.current_size_ = iVar27 + 1;
      pvVar12 = pRVar4->elements[iVar27];
      goto LAB_002004be;
    }
  }
  pFVar22 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                      ((pMVar8->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pMVar8->output_).super_RepeatedPtrFieldBase,pFVar22);
LAB_002004be:
  puVar25 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar25 = (undefined8 *)*puVar25;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),local_b0->name,puVar25);
  if (*(long *)((long)pvVar12 + 0x20) == 0) {
    pAVar29 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar29 = *(Arena **)pAVar29;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar29);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar23 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar29 = (Arena *)(uVar23 & 0xfffffffffffffffc);
    if ((uVar23 & 1) != 0) {
      pAVar29 = *(Arena **)pAVar29;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar29);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  pAVar10->datatype_ = 0x10020;
  if (0 < local_b0->dimension) {
    pRVar1 = &pAVar10->shape_;
    iVar27 = 0;
    do {
      uVar26 = (pAVar10->shape_).current_size_;
      uVar32 = (pAVar10->shape_).total_size_;
      if (uVar26 == uVar32) {
        google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar32 + 1);
      }
      plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
      plVar11[uVar26] = 1;
      pRVar1->current_size_ = uVar26 + 1;
      iVar27 = iVar27 + 1;
    } while (iVar27 < local_b0->dimension);
  }
  m->specificationversion_ = 4;
  if (m->_oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 500;
    uVar23 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar29 = (Arena *)(uVar23 & 0xfffffffffffffffc);
    if ((uVar23 & 1) != 0) {
      pAVar29 = *(Arena **)pAVar29;
    }
    pNVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                        (pAVar29);
    (m->Type_).neuralnetwork_ = pNVar13;
  }
  pNVar13 = (NeuralNetwork *)(m->Type_).pipeline_;
  if (0 < (int)(uint)local_b8) {
    local_60 = &(pNVar13->layers_).super_RepeatedPtrFieldBase;
    local_68 = (uint)local_b8 - 1;
    uVar26 = 0;
    local_58 = pNVar13;
    do {
      this = local_60;
      pRVar4 = (pNVar13->layers_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar4 == (Rep *)0x0) {
LAB_00200631:
        pNVar14 = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>(local_60->arena_);
        local_a0 = (NeuralNetworkLayer *)
                   google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                             (this,pNVar14);
      }
      else {
        iVar27 = (pNVar13->layers_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar4->allocated_size <= iVar27) goto LAB_00200631;
        (pNVar13->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar27 + 1;
        local_a0 = (NeuralNetworkLayer *)pRVar4->elements[iVar27];
      }
      uVar32 = 1;
      if (9 < uVar26) {
        uVar23 = (ulong)uVar26;
        uVar3 = 4;
        do {
          uVar32 = uVar3;
          uVar33 = (uint)uVar23;
          if (uVar33 < 100) {
            uVar32 = uVar32 - 2;
            goto LAB_002006a2;
          }
          if (uVar33 < 1000) {
            uVar32 = uVar32 - 1;
            goto LAB_002006a2;
          }
          if (uVar33 < 10000) goto LAB_002006a2;
          uVar23 = uVar23 / 10000;
          uVar3 = uVar32 + 4;
        } while (99999 < uVar33);
        uVar32 = uVar32 + 1;
      }
LAB_002006a2:
      local_100.name = (char *)&local_f0;
      std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar32);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_100.name,uVar32,uVar26);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x3b9a69);
      plVar24 = plVar11 + 2;
      if ((ArenaStringPtr *)*plVar11 == (ArenaStringPtr *)plVar24) {
        local_98.name_.tagged_ptr_.ptr_ =
             (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )*plVar24;
        local_98.shortdescription_.tagged_ptr_.ptr_ =
             (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )plVar11[3];
        local_98.super_MessageLite._vptr_MessageLite = (_func_int **)&local_98.name_;
      }
      else {
        local_98.name_.tagged_ptr_.ptr_ =
             (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )*plVar24;
        local_98.super_MessageLite._vptr_MessageLite = (_func_int **)*plVar11;
      }
      local_98.super_MessageLite._internal_metadata_.ptr_ = plVar11[1];
      *plVar11 = (long)plVar24;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((long *)local_100.name != &local_f0) {
        operator_delete(local_100.name,local_f0 + 1);
      }
      uVar32 = uVar26 - 1;
      uVar3 = -uVar32;
      if (0 < (int)uVar32) {
        uVar3 = uVar32;
      }
      uVar33 = 1;
      if (9 < uVar3) {
        uVar23 = (ulong)uVar3;
        uVar6 = 4;
        do {
          uVar33 = uVar6;
          uVar7 = (uint)uVar23;
          if (uVar7 < 100) {
            uVar33 = uVar33 - 2;
            goto LAB_002007aa;
          }
          if (uVar7 < 1000) {
            uVar33 = uVar33 - 1;
            goto LAB_002007aa;
          }
          if (uVar7 < 10000) goto LAB_002007aa;
          uVar23 = uVar23 / 10000;
          uVar6 = uVar33 + 4;
        } while (99999 < uVar7);
        uVar33 = uVar33 + 1;
      }
LAB_002007aa:
      local_e0.name = (char *)&local_d0;
      std::__cxx11::string::_M_construct
                ((ulong)&local_e0,(char)uVar33 - (char)((int)uVar32 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_e0.name + (ulong)(uVar32 >> 0x1f)),uVar33,uVar3);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x3dece7);
      local_100.name = (char *)&local_f0;
      plVar24 = plVar11 + 2;
      if ((long *)*plVar11 == plVar24) {
        local_f0 = *plVar24;
        lStack_e8 = plVar11[3];
      }
      else {
        local_f0 = *plVar24;
        local_100.name = (char *)*plVar11;
      }
      local_100._8_8_ = plVar11[1];
      *plVar11 = (long)plVar24;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((long *)local_e0.name != &local_d0) {
        operator_delete(local_e0.name,local_d0 + 1);
      }
      uVar32 = 1;
      if (9 < uVar26) {
        uVar23 = (ulong)uVar26;
        uVar3 = 4;
        do {
          uVar32 = uVar3;
          uVar33 = (uint)uVar23;
          if (uVar33 < 100) {
            uVar32 = uVar32 - 2;
            goto LAB_002008bf;
          }
          if (uVar33 < 1000) {
            uVar32 = uVar32 - 1;
            goto LAB_002008bf;
          }
          if (uVar33 < 10000) goto LAB_002008bf;
          uVar23 = uVar23 / 10000;
          uVar3 = uVar32 + 4;
        } while (99999 < uVar33);
        uVar32 = uVar32 + 1;
      }
LAB_002008bf:
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar32);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50[0],uVar32,uVar26);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3dece7);
      plVar24 = plVar11 + 2;
      if ((long *)*plVar11 == plVar24) {
        local_d0 = *plVar24;
        lStack_c8 = plVar11[3];
        local_e0.name = (char *)&local_d0;
      }
      else {
        local_d0 = *plVar24;
        local_e0.name = (char *)*plVar11;
      }
      local_e0._8_8_ = plVar11[1];
      *plVar11 = (long)plVar24;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      pNVar14 = local_a0;
      pAVar28 = (ArenaStringPtr *)"inner_layer";
      if ((uint)local_b8 != 1) {
        pAVar28 = (ArenaStringPtr *)local_98.super_MessageLite._vptr_MessageLite;
      }
      uVar23 = (local_a0->super_MessageLite)._internal_metadata_.ptr_;
      puVar25 = (undefined8 *)(uVar23 & 0xfffffffffffffffc);
      if ((uVar23 & 1) != 0) {
        puVar25 = (undefined8 *)*puVar25;
      }
      google::protobuf::internal::ArenaStringPtr::
      Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                (&local_a0->name_,pAVar28,puVar25);
      pTVar15 = &local_100;
      if (uVar26 == 0) {
        pTVar15 = local_a8;
      }
      CoreML::Specification::NeuralNetworkLayer::add_input(pNVar14,pTVar15->name);
      pTVar15 = &local_e0;
      if (uVar26 == local_68) {
        pTVar15 = local_b0;
      }
      CoreML::Specification::NeuralNetworkLayer::add_output(pNVar14,pTVar15->name);
      if (pNVar14->_oneof_case_[0] != 0x8c) {
        CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar14);
        pNVar14->_oneof_case_[0] = 0x8c;
        uVar23 = (pNVar14->super_MessageLite)._internal_metadata_.ptr_;
        pAVar29 = (Arena *)(uVar23 & 0xfffffffffffffffc);
        if ((uVar23 & 1) != 0) {
          pAVar29 = *(Arena **)pAVar29;
        }
        pIVar16 = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>(pAVar29);
        (pNVar14->layer_).innerproduct_ = pIVar16;
      }
      pCVar5 = (pNVar14->layer_).convolution_;
      *(undefined8 *)&pCVar5->_kernelsize_cached_byte_size_ = 1;
      (pCVar5->stride_).current_size_ = 1;
      (pCVar5->stride_).total_size_ = 0;
      lVar30._0_4_ = (pCVar5->kernelsize_).current_size_;
      lVar30._4_4_ = (pCVar5->kernelsize_).total_size_;
      if (lVar30 == 0) {
        uVar23 = (pCVar5->super_MessageLite)._internal_metadata_.ptr_;
        pAVar29 = (Arena *)(uVar23 & 0xfffffffffffffffc);
        if ((uVar23 & 1) != 0) {
          pAVar29 = *(Arena **)pAVar29;
        }
        pWVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                            (pAVar29);
        *(WeightParams **)&pCVar5->kernelsize_ = pWVar17;
      }
      lVar30 = *(long *)&pCVar5->kernelsize_;
      if ((char)local_64 == '\0') {
        pRVar2 = (RepeatedField<float> *)(lVar30 + 0x10);
        uVar32 = *(uint *)(lVar30 + 0x10);
        if (uVar32 == *(uint *)(lVar30 + 0x14)) {
          google::protobuf::RepeatedField<float>::Reserve(pRVar2,*(uint *)(lVar30 + 0x14) + 1);
        }
        pfVar20 = google::protobuf::RepeatedField<float>::elements(pRVar2);
        pfVar20[uVar32] = 1.0;
        pRVar2->current_size_ = uVar32 + 1;
      }
      else {
        if (*(long *)(lVar30 + 0x38) == 0) {
          pAVar29 = (Arena *)(*(ulong *)(lVar30 + 8) & 0xfffffffffffffffc);
          if ((*(ulong *)(lVar30 + 8) & 1) != 0) {
            pAVar29 = *(Arena **)pAVar29;
          }
          pQVar18 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::QuantizationParams>(pAVar29);
          *(QuantizationParams **)(lVar30 + 0x38) = pQVar18;
        }
        pQVar18 = *(QuantizationParams **)(lVar30 + 0x38);
        pQVar18->numberofbits_ = 1;
        if (pQVar18->_oneof_case_[0] != 0x65) {
          CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar18);
          pQVar18->_oneof_case_[0] = 0x65;
          uVar23 = (pQVar18->super_MessageLite)._internal_metadata_.ptr_;
          pAVar29 = (Arena *)(uVar23 & 0xfffffffffffffffc);
          if ((uVar23 & 1) != 0) {
            pAVar29 = *(Arena **)pAVar29;
          }
          pLVar19 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::LinearQuantizationParams>(pAVar29);
          (pQVar18->QuantizationType_).linearquantization_ = pLVar19;
        }
        pLVar19 = (pQVar18->QuantizationType_).linearquantization_;
        uVar32 = (pLVar19->scale_).current_size_;
        uVar3 = (pLVar19->scale_).total_size_;
        if (uVar32 == uVar3) {
          google::protobuf::RepeatedField<float>::Reserve(&pLVar19->scale_,uVar3 + 1);
        }
        pfVar20 = google::protobuf::RepeatedField<float>::elements(&pLVar19->scale_);
        pfVar20[uVar32] = 1.0;
        (pLVar19->scale_).current_size_ = uVar32 + 1;
        pRVar2 = &pLVar19->bias_;
        uVar32 = (pLVar19->bias_).current_size_;
        uVar3 = (pLVar19->bias_).total_size_;
        if (uVar32 == uVar3) {
          google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar3 + 1);
        }
        pfVar20 = google::protobuf::RepeatedField<float>::elements(pRVar2);
        pfVar20[uVar32] = 0.0;
        pRVar2->current_size_ = uVar32 + 1;
        puVar25 = (undefined8 *)(*(ulong *)(lVar30 + 8) & 0xfffffffffffffffc);
        if ((*(ulong *)(lVar30 + 8) & 1) != 0) {
          puVar25 = (undefined8 *)*puVar25;
        }
        google::protobuf::internal::ArenaStringPtr::
        Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                  ((ArenaStringPtr *)(lVar30 + 0x30),"x01",puVar25);
      }
      *(undefined1 *)&(pCVar5->stride_).arena_or_elements_ = 1;
      if ((pCVar5->kernelsize_).arena_or_elements_ == (void *)0x0) {
        uVar23 = (pCVar5->super_MessageLite)._internal_metadata_.ptr_;
        pAVar29 = (Arena *)(uVar23 & 0xfffffffffffffffc);
        if ((uVar23 & 1) != 0) {
          pAVar29 = *(Arena **)pAVar29;
        }
        pWVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                            (pAVar29);
        (pCVar5->kernelsize_).arena_or_elements_ = pWVar17;
      }
      pvVar12 = (pCVar5->kernelsize_).arena_or_elements_;
      if (isBiasQuantized) {
        if (*(long *)((long)pvVar12 + 0x38) == 0) {
          pAVar29 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
          if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
            pAVar29 = *(Arena **)pAVar29;
          }
          pQVar18 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::QuantizationParams>(pAVar29);
          *(QuantizationParams **)((long)pvVar12 + 0x38) = pQVar18;
        }
        pQVar18 = *(QuantizationParams **)((long)pvVar12 + 0x38);
        pQVar18->numberofbits_ = 1;
        if (pQVar18->_oneof_case_[0] != 0x65) {
          CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar18);
          pQVar18->_oneof_case_[0] = 0x65;
          uVar23 = (pQVar18->super_MessageLite)._internal_metadata_.ptr_;
          pAVar29 = (Arena *)(uVar23 & 0xfffffffffffffffc);
          if ((uVar23 & 1) != 0) {
            pAVar29 = *(Arena **)pAVar29;
          }
          pLVar19 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::LinearQuantizationParams>(pAVar29);
          (pQVar18->QuantizationType_).linearquantization_ = pLVar19;
        }
        pLVar19 = (pQVar18->QuantizationType_).linearquantization_;
        uVar32 = (pLVar19->scale_).current_size_;
        uVar3 = (pLVar19->scale_).total_size_;
        if (uVar32 == uVar3) {
          google::protobuf::RepeatedField<float>::Reserve(&pLVar19->scale_,uVar3 + 1);
        }
        pfVar20 = google::protobuf::RepeatedField<float>::elements(&pLVar19->scale_);
        pfVar20[uVar32] = 1.0;
        (pLVar19->scale_).current_size_ = uVar32 + 1;
        pRVar2 = &pLVar19->bias_;
        uVar32 = (pLVar19->bias_).current_size_;
        uVar3 = (pLVar19->bias_).total_size_;
        if (uVar32 == uVar3) {
          google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar3 + 1);
        }
        pfVar20 = google::protobuf::RepeatedField<float>::elements(pRVar2);
        pfVar20[uVar32] = 0.0;
        pRVar2->current_size_ = uVar32 + 1;
        puVar25 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
        if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
          puVar25 = (undefined8 *)*puVar25;
        }
        google::protobuf::internal::ArenaStringPtr::
        Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                  ((ArenaStringPtr *)((long)pvVar12 + 0x30),"x01",puVar25);
      }
      else {
        pRVar2 = (RepeatedField<float> *)((long)pvVar12 + 0x10);
        uVar32 = *(uint *)((long)pvVar12 + 0x10);
        if (uVar32 == *(uint *)((long)pvVar12 + 0x14)) {
          google::protobuf::RepeatedField<float>::Reserve
                    (pRVar2,*(uint *)((long)pvVar12 + 0x14) + 1);
        }
        pfVar20 = google::protobuf::RepeatedField<float>::elements(pRVar2);
        pfVar20[uVar32] = 1.0;
        pRVar2->current_size_ = uVar32 + 1;
      }
      if ((char)local_bc != '\0') {
        local_a0->isupdatable_ = true;
        lVar31._0_4_ = (pCVar5->kernelsize_).current_size_;
        lVar31._4_4_ = (pCVar5->kernelsize_).total_size_;
        if (lVar31 == 0) {
          uVar23 = (pCVar5->super_MessageLite)._internal_metadata_.ptr_;
          pAVar29 = (Arena *)(uVar23 & 0xfffffffffffffffc);
          if ((uVar23 & 1) != 0) {
            pAVar29 = *(Arena **)pAVar29;
          }
          pWVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                              (pAVar29);
          *(WeightParams **)&pCVar5->kernelsize_ = pWVar17;
        }
        *(undefined1 *)(*(long *)&pCVar5->kernelsize_ + 0x40) = 1;
        if ((pCVar5->kernelsize_).arena_or_elements_ == (void *)0x0) {
          uVar23 = (pCVar5->super_MessageLite)._internal_metadata_.ptr_;
          pAVar29 = (Arena *)(uVar23 & 0xfffffffffffffffc);
          if ((uVar23 & 1) != 0) {
            pAVar29 = *(Arena **)pAVar29;
          }
          pWVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                              (pAVar29);
          (pCVar5->kernelsize_).arena_or_elements_ = pWVar17;
        }
        *(undefined1 *)((long)(pCVar5->kernelsize_).arena_or_elements_ + 0x40) = 1;
      }
      if ((long *)local_e0.name != &local_d0) {
        operator_delete(local_e0.name,local_d0 + 1);
      }
      pNVar13 = local_58;
      if ((long *)local_100.name != &local_f0) {
        operator_delete(local_100.name,local_f0 + 1);
      }
      if ((ArenaStringPtr *)local_98.super_MessageLite._vptr_MessageLite != &local_98.name_) {
        operator_delete(local_98.super_MessageLite._vptr_MessageLite,
                        (long)local_98.name_.tagged_ptr_.ptr_ + 1);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != (uint)local_b8);
  }
  if ((char)local_bc != '\0') {
    m->isupdatable_ = true;
    puVar21 = (undefined1 *)m->description_;
    if ((ModelDescription *)puVar21 == (ModelDescription *)0x0) {
      puVar21 = CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar4 = (((ModelDescription *)puVar21)->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar34 = pRVar4->elements;
    if (pRVar4 == (Rep *)0x0) {
      ppvVar34 = (void **)0x0;
    }
    lVar30 = (long)(((ModelDescription *)puVar21)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar30 != 0) {
      lVar31 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  (&local_98,*(FeatureDescription **)((long)ppvVar34 + lVar31));
        if (m->description_ == (ModelDescription *)0x0) {
          uVar23 = (m->super_MessageLite)._internal_metadata_.ptr_;
          pAVar29 = (Arena *)(uVar23 & 0xfffffffffffffffc);
          if ((uVar23 & 1) != 0) {
            pAVar29 = *(Arena **)pAVar29;
          }
          pMVar8 = google::protobuf::Arena::
                   CreateMaybeMessage<CoreML::Specification::ModelDescription>(pAVar29);
          m->description_ = pMVar8;
        }
        pMVar8 = m->description_;
        pRVar4 = (pMVar8->traininginput_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar4 == (Rep *)0x0) {
LAB_00200ec1:
          pFVar22 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                              ((pMVar8->traininginput_).super_RepeatedPtrFieldBase.arena_);
          pFVar22 = (FeatureDescription *)
                    google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                              (&(pMVar8->traininginput_).super_RepeatedPtrFieldBase,pFVar22);
        }
        else {
          iVar27 = (pMVar8->traininginput_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar4->allocated_size <= iVar27) goto LAB_00200ec1;
          (pMVar8->traininginput_).super_RepeatedPtrFieldBase.current_size_ = iVar27 + 1;
          pFVar22 = (FeatureDescription *)pRVar4->elements[iVar27];
        }
        CoreML::Specification::FeatureDescription::CopyFrom(pFVar22,&local_98);
        CoreML::Specification::FeatureDescription::~FeatureDescription(&local_98);
        lVar31 = lVar31 + 8;
      } while (lVar30 * 8 != lVar31);
    }
  }
  return pNVar13;
}

Assistant:

Specification::NeuralNetwork* buildBasicNeuralNetworkModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, int numberOfLayers, bool areWeightsQuantized, bool isBiasQuantized) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorAttr->name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < outTensorAttr->dimension; i++) {
        outTensorShape->add_shape(1);
    }
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto neuralNet = m.mutable_neuralnetwork();
    
    for (int i = 0; i < numberOfLayers; i++) {
        auto layer = neuralNet->add_layers();
        
        std::string layerName = "inner_layer" + std::to_string(i);
        std::string input = "output" + std::to_string(i-1);
        std::string output = "output" + std::to_string(i);
        
        layer->set_name((numberOfLayers == 1) ? "inner_layer" : layerName.c_str());
        layer->add_input((i == 0) ? inTensorAttr->name : input.c_str());
        layer->add_output((i == numberOfLayers-1) ? outTensorAttr->name : output.c_str());
        
        Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
        innerProductParams->set_inputchannels(1);
        innerProductParams->set_outputchannels(1);

        // set weight
        auto* weights = innerProductParams->mutable_weights();
        if (areWeightsQuantized) {
            auto *quant_params = weights->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            weights->set_int8rawvalue("x01"); // this is [1]
        } else {
            weights->add_floatvalue(1.0);
        }

        // set bias
        innerProductParams->set_hasbias(true);
        auto* bias = innerProductParams->mutable_bias();
        if (isBiasQuantized) {
            auto *quant_params = bias->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            bias->set_int8rawvalue("x01"); // this is [1]
        } else {
            bias->add_floatvalue(1.0);
        }
        
        if (isUpdatable) {
            layer->set_isupdatable(true);
            innerProductParams->mutable_weights()->set_isupdatable(true);
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
    }
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
    }
    
    return neuralNet;
}